

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall ON_MeshCache::ClearAllMeshes(ON_MeshCache *this,bool bDeleteMesh)

{
  ON_MeshCacheItem *pOVar1;
  ON_MeshCacheItem *item;
  
  item = this->m_impl;
  if (item != (ON_MeshCacheItem *)0x0) {
    this->m_impl = (ON_MeshCacheItem *)0x0;
    while (item != (ON_MeshCacheItem *)0x0) {
      pOVar1 = item->m_next;
      Internal_DeleteItem(this,item,bDeleteMesh);
      item = pOVar1;
    }
  }
  return;
}

Assistant:

void ON_MeshCache::ClearAllMeshes(bool bDeleteMesh)
{
  if ( 0 != m_impl )
  {
    ON_MeshCacheItem* next = m_impl;
    m_impl = nullptr;
    for (ON_MeshCacheItem* item = next; nullptr != item; item = next)
    {
      next = item->m_next;
      Internal_DeleteItem(item,bDeleteMesh);
    }
  }
}